

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gcm.c
# Opt level: O0

int mbedtls_gcm_auth_decrypt
              (mbedtls_gcm_context *ctx,size_t length,uchar *iv,size_t iv_len,uchar *add,
              size_t add_len,uchar *tag,size_t tag_len,uchar *input,uchar *output)

{
  byte bVar1;
  ulong uStack_70;
  int diff;
  size_t i;
  uchar check_tag [16];
  int ret;
  size_t add_len_local;
  uchar *add_local;
  size_t iv_len_local;
  uchar *iv_local;
  size_t length_local;
  mbedtls_gcm_context *ctx_local;
  
  check_tag[0xc] = 0x92;
  check_tag[0xd] = 0xff;
  check_tag[0xe] = 0xff;
  check_tag[0xf] = 0xff;
  ctx_local._4_4_ =
       mbedtls_gcm_crypt_and_tag
                 (ctx,0,length,iv,iv_len,add,add_len,input,output,tag_len,(uchar *)&i);
  check_tag[0xc] = (char)ctx_local._4_4_;
  check_tag[0xd] = (char)((uint)ctx_local._4_4_ >> 8);
  check_tag[0xe] = (char)((uint)ctx_local._4_4_ >> 0x10);
  check_tag[0xf] = (char)((uint)ctx_local._4_4_ >> 0x18);
  if (ctx_local._4_4_ == 0) {
    bVar1 = 0;
    for (uStack_70 = 0; uStack_70 < tag_len; uStack_70 = uStack_70 + 1) {
      bVar1 = tag[uStack_70] ^ check_tag[uStack_70 - 8] | bVar1;
    }
    if (bVar1 == 0) {
      ctx_local._4_4_ = 0;
    }
    else {
      mbedtls_platform_zeroize(output,length);
      ctx_local._4_4_ = -0x12;
    }
  }
  return ctx_local._4_4_;
}

Assistant:

int mbedtls_gcm_auth_decrypt( mbedtls_gcm_context *ctx,
                      size_t length,
                      const unsigned char *iv,
                      size_t iv_len,
                      const unsigned char *add,
                      size_t add_len,
                      const unsigned char *tag,
                      size_t tag_len,
                      const unsigned char *input,
                      unsigned char *output )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    unsigned char check_tag[16];
    size_t i;
    int diff;

    GCM_VALIDATE_RET( ctx != NULL );
    GCM_VALIDATE_RET( iv != NULL );
    GCM_VALIDATE_RET( add_len == 0 || add != NULL );
    GCM_VALIDATE_RET( tag != NULL );
    GCM_VALIDATE_RET( length == 0 || input != NULL );
    GCM_VALIDATE_RET( length == 0 || output != NULL );

    if( ( ret = mbedtls_gcm_crypt_and_tag( ctx, MBEDTLS_GCM_DECRYPT, length,
                                   iv, iv_len, add, add_len,
                                   input, output, tag_len, check_tag ) ) != 0 )
    {
        return( ret );
    }

    /* Check tag in "constant-time" */
    for( diff = 0, i = 0; i < tag_len; i++ )
        diff |= tag[i] ^ check_tag[i];

    if( diff != 0 )
    {
        mbedtls_platform_zeroize( output, length );
        return( MBEDTLS_ERR_GCM_AUTH_FAILED );
    }

    return( 0 );
}